

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O1

int __thiscall Opt::parse_options(Opt *this,char **argv,int *i,bool *options_parsing)

{
  bool bVar1;
  int iVar2;
  
  if ((*options_parsing == true) &&
     ((bVar1 = parse_flag(this,argv,*i,"-v","--verbose"), bVar1 ||
      (bVar1 = parse_flag(this,argv,*i,"-v","--log-verbose"), bVar1)))) {
    this->verbose = true;
    return 0;
  }
  if (*options_parsing == true) {
    iVar2 = strcmp(argv[*i],"--jinja");
    if (iVar2 == 0) {
      this->use_jinja = true;
      return 0;
    }
    bVar1 = parse_flag(this,argv,*i,"-h","--help");
    if (bVar1) {
      this->help = true;
      return 0;
    }
  }
  if (*options_parsing != true) {
    return 2;
  }
  iVar2 = strcmp(argv[*i],"--");
  if (iVar2 == 0) {
    *options_parsing = false;
    return 0;
  }
  return 2;
}

Assistant:

int parse_options(const char ** argv, int & i, bool & options_parsing) {
        if (options_parsing && (parse_flag(argv, i, "-v", "--verbose") || parse_flag(argv, i, "-v", "--log-verbose"))) {
            verbose = true;
        } else if (options_parsing && strcmp(argv[i], "--jinja") == 0) {
            use_jinja = true;
        } else if (options_parsing && parse_flag(argv, i, "-h", "--help")) {
            help = true;
            return 0;
        } else if (options_parsing && strcmp(argv[i], "--") == 0) {
            options_parsing = false;
        } else {
            return 2;
        }

        return 0;
    }